

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassemble.cpp
# Opt level: O0

spv_result_t
spvtools::anon_unknown_0::DisassembleTargetInstruction
          (void *user_data,spv_parsed_instruction_t *parsed_instruction)

{
  bool bVar1;
  spv_result_t sVar2;
  size_t sVar3;
  uint32_t *__first1;
  uint32_t *puVar4;
  Disassembler *this;
  spv_result_t error;
  WrappedDisassembler *wrapped;
  spv_parsed_instruction_t *parsed_instruction_local;
  void *user_data_local;
  
  if (user_data == (void *)0x0) {
    __assert_fail("user_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/disassemble.cpp"
                  ,0x246,
                  "spv_result_t spvtools::(anonymous namespace)::DisassembleTargetInstruction(void *, const spv_parsed_instruction_t *)"
                 );
  }
  sVar3 = WrappedDisassembler::word_count((WrappedDisassembler *)user_data);
  if (sVar3 == parsed_instruction->num_words) {
    __first1 = WrappedDisassembler::inst_binary((WrappedDisassembler *)user_data);
    puVar4 = WrappedDisassembler::inst_binary((WrappedDisassembler *)user_data);
    sVar3 = WrappedDisassembler::word_count((WrappedDisassembler *)user_data);
    bVar1 = std::equal<unsigned_int_const*,unsigned_int_const*>
                      (__first1,puVar4 + sVar3,parsed_instruction->words);
    if (bVar1) {
      this = WrappedDisassembler::disassembler((WrappedDisassembler *)user_data);
      sVar2 = Disassembler::HandleInstruction(this,parsed_instruction);
      if (sVar2 != SPV_SUCCESS) {
        return sVar2;
      }
      return SPV_REQUESTED_TERMINATION;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t DisassembleTargetInstruction(
    void* user_data, const spv_parsed_instruction_t* parsed_instruction) {
  assert(user_data);
  auto wrapped = static_cast<WrappedDisassembler*>(user_data);
  // Check if this is the instruction we want to disassemble.
  if (wrapped->word_count() == parsed_instruction->num_words &&
      std::equal(wrapped->inst_binary(),
                 wrapped->inst_binary() + wrapped->word_count(),
                 parsed_instruction->words)) {
    // Found the target instruction. Disassemble it and signal that we should
    // stop searching so we don't output the same instruction again.
    if (auto error =
            wrapped->disassembler()->HandleInstruction(*parsed_instruction))
      return error;
    return SPV_REQUESTED_TERMINATION;
  }
  return SPV_SUCCESS;
}